

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::generateTriangles(Geometry *this,int8 *adc)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint16 uVar7;
  uint uVar8;
  MeshHeader *pMVar9;
  long lVar10;
  Material **ppMVar11;
  MeshHeader *pMVar12;
  Triangle *pTVar13;
  uint16 uVar14;
  int8 *piVar15;
  uint uVar16;
  int32 iVar17;
  uint uVar18;
  uint uVar19;
  MeshHeader *pMVar20;
  ulong uVar21;
  int32 i;
  uint uVar22;
  int iVar23;
  
  pMVar9 = this->meshHeader;
  this->numTriangles = 0;
  pMVar12 = pMVar9 + 1;
  uVar1 = pMVar9->numMeshes;
  if (uVar1 != 0) {
    iVar17 = this->numTriangles;
    uVar18 = 0;
    piVar15 = adc;
    pMVar20 = pMVar12;
    do {
      uVar19 = pMVar20->totalIndices;
      if (2 < (ulong)uVar19) {
        if (pMVar9->flags == 1) {
          if (uVar19 - 2 != 0) {
            uVar21 = 0;
            do {
              if ((adc == (int8 *)0x0) || (piVar15[uVar21 + 2] == '\0')) {
                lVar10 = *(long *)pMVar20;
                sVar2 = *(short *)(lVar10 + uVar21 * 2);
                sVar3 = *(short *)(lVar10 + 2 + uVar21 * 2);
                if ((sVar2 != sVar3) &&
                   ((sVar4 = *(short *)(lVar10 + 4 + uVar21 * 2), sVar2 != sVar4 && (sVar3 != sVar4)
                    ))) {
                  iVar17 = iVar17 + 1;
                  this->numTriangles = iVar17;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar19 - 2 != uVar21);
          }
        }
        else {
          iVar17 = iVar17 + uVar19 / 3;
          this->numTriangles = iVar17;
        }
      }
      pMVar20 = (MeshHeader *)&pMVar20[1].totalIndices;
      piVar15 = piVar15 + uVar19;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar1);
  }
  if (pMVar9->numMeshes != 0) {
    pTVar13 = this->triangles;
    ppMVar11 = (this->matList).materials;
    uVar18 = (this->matList).numMaterials;
    uVar19 = 0;
    piVar15 = adc;
    do {
      uVar8 = pMVar12->totalIndices;
      if (2 < (ulong)uVar8) {
        uVar14 = 0xffff;
        if (0 < (int)uVar18) {
          uVar21 = 0;
          do {
            if (ppMVar11[uVar21] == *(Material **)(pMVar12 + 1)) {
              uVar14 = (uint16)uVar21;
              break;
            }
            uVar21 = uVar21 + 1;
          } while (uVar18 != uVar21);
        }
        uVar16 = uVar8 - 2;
        if (pMVar9->flags == 1) {
          if (uVar16 != 0) {
            uVar21 = 0;
            do {
              uVar22 = (uint)uVar21;
              if ((adc == (int8 *)0x0) || (piVar15[uVar22 + 2] == '\0')) {
                lVar10 = *(long *)pMVar12;
                uVar5 = *(uint16 *)(lVar10 + uVar21 * 2);
                uVar6 = *(uint16 *)(lVar10 + 2 + uVar21 * 2);
                if ((uVar5 != uVar6) &&
                   ((uVar7 = *(uint16 *)(lVar10 + 4 + uVar21 * 2), uVar5 != uVar7 &&
                    (uVar6 != uVar7)))) {
                  pTVar13->v[0] = uVar5;
                  pTVar13->v[1] = *(uint16 *)(lVar10 + (ulong)((uVar22 & 1) + 1 + uVar22) * 2);
                  pTVar13->v[2] = *(uint16 *)(lVar10 + (ulong)(uVar22 + 2 & 0xfffffffe) * 2);
                  pTVar13->matId = uVar14;
                  pTVar13 = pTVar13 + 1;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar16 != uVar21);
          }
        }
        else if (uVar16 != 0) {
          lVar10 = *(long *)pMVar12;
          uVar21 = 0;
          do {
            iVar23 = (int)uVar21;
            pTVar13->v[0] = *(uint16 *)(lVar10 + uVar21 * 2);
            pTVar13->v[1] = *(uint16 *)(lVar10 + (ulong)(iVar23 + 1) * 2);
            pTVar13->v[2] = *(uint16 *)(lVar10 + (ulong)(iVar23 + 2) * 2);
            pTVar13->matId = uVar14;
            pTVar13 = pTVar13 + 1;
            uVar21 = (ulong)(iVar23 + 3U);
          } while (iVar23 + 3U < uVar16);
        }
      }
      pMVar12 = (MeshHeader *)&pMVar12[1].totalIndices;
      piVar15 = piVar15 + uVar8;
      uVar19 = uVar19 + 1;
    } while (uVar19 < pMVar9->numMeshes);
  }
  return;
}

Assistant:

void
Geometry::generateTriangles(int8 *adc)
{
	MeshHeader *header = this->meshHeader;
	assert(header != nil);

	this->numTriangles = 0;
	Mesh *m = header->getMeshes();
	int8 *adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			// shouldn't happen but it does
			adcbits += m->numIndices;
			m++;
			continue;
		}
		if(header->flags == MeshHeader::TRISTRIP){
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if(!(adc && adcbits[j+2]) &&
				   !isDegenerate(&m->indices[j]))
					this->numTriangles++;
			}
		}else
			this->numTriangles += m->numIndices/3;
		adcbits += m->numIndices;
		m++;
	}

	Triangle *tri = this->triangles;
	m = header->getMeshes();
	adcbits = adc;
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(m->numIndices < 3){
			adcbits += m->numIndices;
			m++;
			continue;
		}
		int32 matid = this->matList.findIndex(m->material);
		if(header->flags == MeshHeader::TRISTRIP)
			for(uint32 j = 0; j < m->numIndices-2; j++){
				if((adc && adcbits[j+2]) ||
				   isDegenerate(&m->indices[j]))
					continue;
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1 + (j%2)];
				tri->v[2] = m->indices[j+2 - (j%2)];
				tri->matId = matid;
				tri++;
			}
		else
			for(uint32 j = 0; j < m->numIndices-2; j+=3){
				tri->v[0] = m->indices[j+0];
				tri->v[1] = m->indices[j+1];
				tri->v[2] = m->indices[j+2];
				tri->matId = matid;
				tri++;
			}
		adcbits += m->numIndices;
		m++;
	}
}